

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlDocPtr xmlNewDoc(xmlChar *version)

{
  xmlChar *pxVar1;
  xmlRegisterNodeFunc *pp_Var2;
  xmlDocPtr cur;
  xmlChar *version_local;
  
  cur = (xmlDocPtr)version;
  if (version == (xmlChar *)0x0) {
    cur = (xmlDocPtr)0x2721e7;
  }
  version_local = (xmlChar *)(*xmlMalloc)(0xb0);
  if ((xmlNodePtr)version_local == (xmlNodePtr)0x0) {
    xmlTreeErrMemory("building doc");
    version_local = (xmlChar *)0x0;
  }
  else {
    memset(version_local,0,0xb0);
    ((_xmlDoc *)version_local)->type = XML_DOCUMENT_NODE;
    pxVar1 = xmlStrdup((xmlChar *)cur);
    ((_xmlDoc *)version_local)->version = pxVar1;
    if (((_xmlDoc *)version_local)->version == (xmlChar *)0x0) {
      xmlTreeErrMemory("building doc");
      (*xmlFree)(version_local);
      version_local = (xmlChar *)0x0;
    }
    else {
      ((_xmlDoc *)version_local)->standalone = 0xffffffff;
      ((_xmlDoc *)version_local)->compression = 0xffffffff;
      ((_xmlDoc *)version_local)->doc = (_xmlDoc *)version_local;
      ((_xmlDoc *)version_local)->parseFlags = 0;
      ((_xmlDoc *)version_local)->properties = 0x20;
      ((_xmlDoc *)version_local)->charset = 1;
      if ((__xmlRegisterCallbacks != 0) &&
         (pp_Var2 = __xmlRegisterNodeDefaultValue(), *pp_Var2 != (xmlRegisterNodeFunc)0x0)) {
        pp_Var2 = __xmlRegisterNodeDefaultValue();
        (**pp_Var2)((xmlNodePtr)version_local);
      }
    }
  }
  return (xmlDocPtr)version_local;
}

Assistant:

xmlDocPtr
xmlNewDoc(const xmlChar *version) {
    xmlDocPtr cur;

    if (version == NULL)
	version = (const xmlChar *) "1.0";

    /*
     * Allocate a new document and fill the fields.
     */
    cur = (xmlDocPtr) xmlMalloc(sizeof(xmlDoc));
    if (cur == NULL) {
	xmlTreeErrMemory("building doc");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlDoc));
    cur->type = XML_DOCUMENT_NODE;

    cur->version = xmlStrdup(version);
    if (cur->version == NULL) {
	xmlTreeErrMemory("building doc");
	xmlFree(cur);
	return(NULL);
    }
    cur->standalone = -1;
    cur->compression = -1; /* not initialized */
    cur->doc = cur;
    cur->parseFlags = 0;
    cur->properties = XML_DOC_USERBUILT;
    /*
     * The in memory encoding is always UTF8
     * This field will never change and would
     * be obsolete if not for binary compatibility.
     */
    cur->charset = XML_CHAR_ENCODING_UTF8;

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)cur);
    return(cur);
}